

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

AggregateFunction * duckdb::GetFallbackEntropyFunction(LogicalType *type)

{
  initializer_list<duckdb::LogicalType> iVar1;
  LogicalType *in_RSI;
  AggregateFunction *in_RDI;
  aggregate_destructor_t unaff_retaddr;
  aggregate_statistics_t in_stack_00000008;
  aggregate_window_t in_stack_00000010;
  aggregate_serialize_t in_stack_00000018;
  aggregate_deserialize_t in_stack_00000020;
  AggregateFunction *func;
  allocator_type *in_stack_fffffffffffffec8;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffed0;
  iterator in_stack_fffffffffffffed8;
  size_type in_stack_fffffffffffffee0;
  LogicalType *local_b0;
  aggregate_update_t in_stack_ffffffffffffff78;
  aggregate_initialize_t in_stack_ffffffffffffff80;
  aggregate_size_t in_stack_ffffffffffffff88;
  LogicalType *in_stack_ffffffffffffff90;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff98;
  AggregateFunction *this;
  undefined1 local_58 [24];
  undefined1 *local_40;
  undefined8 local_38;
  aggregate_combine_t in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar2;
  AggregateFunction *bind;
  
  uVar2 = 0;
  this = (AggregateFunction *)local_58;
  bind = in_RDI;
  duckdb::LogicalType::LogicalType((LogicalType *)this,in_RSI);
  local_40 = local_58;
  local_38 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x9ba042);
  iVar1._M_len = in_stack_fffffffffffffee0;
  iVar1._M_array = in_stack_fffffffffffffed8;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffed0,iVar1,in_stack_fffffffffffffec8);
  duckdb::LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffff78,DOUBLE);
  AggregateFunction::AggregateFunction
            (this,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffffe0,
             (aggregate_finalize_t)CONCAT17(uVar2,in_stack_ffffffffffffffe8),
             (aggregate_simple_update_t)in_RSI,(bind_aggregate_function_t)bind,unaff_retaddr,
             in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020);
  duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffff78);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x9ba123);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x9ba130);
  local_b0 = (LogicalType *)&local_40;
  do {
    local_b0 = local_b0 + -0x18;
    duckdb::LogicalType::~LogicalType(local_b0);
  } while (local_b0 != (LogicalType *)local_58);
  in_RDI->destructor =
       AggregateFunction::
       StateDestroy<duckdb::ModeState<duckdb::string_t,duckdb::ModeString>,duckdb::EntropyFallbackFunction<duckdb::ModeString>>
  ;
  in_RDI->field_0xa9 = 1;
  return in_RDI;
}

Assistant:

AggregateFunction GetFallbackEntropyFunction(const LogicalType &type) {
	using STATE = ModeState<string_t, ModeString>;
	using OP = EntropyFallbackFunction<ModeString>;
	AggregateFunction func({type}, LogicalType::DOUBLE, AggregateFunction::StateSize<STATE>,
	                       AggregateFunction::StateInitialize<STATE, OP, AggregateDestructorType::LEGACY>,
	                       AggregateSortKeyHelpers::UnaryUpdate<STATE, OP>, AggregateFunction::StateCombine<STATE, OP>,
	                       AggregateFunction::StateFinalize<STATE, double, OP>, nullptr);
	func.destructor = AggregateFunction::StateDestroy<STATE, OP>;
	func.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	return func;
}